

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O0

Range<float,_3> * __thiscall
Nova::Grid<float,_3>::Cell_Domain
          (Range<float,_3> *__return_storage_ptr__,Grid<float,_3> *this,T_INDEX *index)

{
  Vector<float,_3,_true> local_50;
  Vector<float,_3,_true> local_44;
  Vector<float,_3,_true> local_38;
  undefined1 local_2c [8];
  TV corner;
  T_INDEX *index_local;
  Grid<float,_3> *this_local;
  
  corner._data._M_elems._4_8_ = index;
  Vector<float,_3,_true>::Vector<int>(&local_44,index);
  Vector<float,_3,_true>::operator*(&local_38,&local_44);
  Vector<float,_3,_true>::operator+((Vector<float,_3,_true> *)local_2c,&(this->domain).min_corner);
  Vector<float,_3,_true>::operator-(&local_50,(Vector<float,_3,_true> *)local_2c);
  Range<float,_3>::Range(__return_storage_ptr__,&local_50,(TV *)local_2c);
  return __return_storage_ptr__;
}

Assistant:

Range<T,d> Cell_Domain(const T_INDEX& index) const
    {
        TV corner=domain.min_corner+TV(index)*dX;
        return Range<T,d>(corner-dX,corner);
    }